

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O0

void __thiscall CMU462::EdgeRecord::EdgeRecord(EdgeRecord *this,EdgeIter *_edge)

{
  EdgeIter *_edge_local;
  EdgeRecord *this_local;
  
  (this->edge)._M_node = _edge->_M_node;
  Vector3D::Vector3D(&this->optimalPoint);
  return;
}

Assistant:

EdgeRecord::EdgeRecord(EdgeIter& _edge) : edge(_edge) {

    // TODO: (meshEdit)
    // Compute the combined quadric from the edge endpoints.
    // -> Build the 3x3 linear system whose solution minimizes the quadric error
    //    associated with these two endpoints.
    // -> Use this system to solve for the optimal position, and store it in
    //    EdgeRecord::optimalPoint.
    // -> Also store the cost associated with collapsing this edg in
    //    EdgeRecord::Cost.

  }